

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_26UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,FixedArray<char,_1UL> *params_4)

{
  size_t sVar1;
  char *__n;
  long lVar2;
  size_t size;
  char *__dest;
  long local_58;
  char *local_50;
  undefined8 local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_58 = *(long *)(this + 8);
  local_50 = params->ptr;
  local_48 = *(undefined8 *)params_1->content;
  local_40 = params_2->size_;
  local_38 = 1;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)&local_58 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x28);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  __n = params->ptr;
  if (__n != (char *)0x0) {
    memcpy(__dest,&params->size_,(size_t)__n);
    __dest = __dest + (long)__n;
  }
  sVar1 = *(size_t *)params_1->content;
  if (sVar1 != 0) {
    memcpy(__dest,(void *)params_1->currentSize,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params_2->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params_2->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  *__dest = *(char *)&params_3->ptr;
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}